

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O1

bool tinyusdz::hasEscapedTripleQuotes(string *str,bool is_double_quote,size_t *n)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar2 = str->_M_string_length;
  if (uVar2 == 0) {
    sVar4 = 0;
  }
  else {
    pcVar3 = (str->_M_dataplus)._M_p;
    uVar5 = 0;
    sVar4 = 0;
    do {
      if ((pcVar3[uVar5] == '\\') && (uVar1 = uVar5 + 3, uVar1 < uVar2)) {
        if (is_double_quote) {
          if (((pcVar3[uVar5 + 1] == '\"') && (pcVar3[uVar5 + 2] == '\"')) &&
             (pcVar3[uVar1] == '\"')) goto LAB_0014de7b;
        }
        else if (((pcVar3[uVar5 + 1] == '\'') && (pcVar3[uVar5 + 2] == '\'')) &&
                (pcVar3[uVar1] == '\'')) {
LAB_0014de7b:
          if (n == (size_t *)0x0) {
            return true;
          }
          sVar4 = sVar4 + 1;
          uVar5 = uVar1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar2);
  }
  if (n != (size_t *)0x0) {
    *n = sVar4;
  }
  return sVar4 != 0;
}

Assistant:

bool hasEscapedTripleQuotes(const std::string &str, bool is_double_quote,
                            size_t *n) {
  size_t count = 0;

  for (size_t i = 0; i < str.size(); i++) {
    if (str[i] == '\\') {
      if (i + 3 < str.size()) {
        if (is_double_quote) {
          if ((str[i + 1] == '"') && (str[i + 2] == '"') &&
              (str[i + 3] == '"')) {
            if (!n) {  // early exit
              return true;
            }

            count++;
            i += 3;
          }
        } else {
          if ((str[i + 1] == '\'') && (str[i + 2] == '\'') &&
              (str[i + 3] == '\'')) {
            if (!n) {  // early exit
              return true;
            }
            count++;
            i += 3;
          }
        }
      }
    }
  }

  if (n) {
    (*n) = count;
  }

  return count > 0;
}